

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::zesDriverGetDeviceByUuidExp
          (validation_layer *this,zes_driver_handle_t hDriver,zes_uuid_t uuid,
          zes_device_handle_t *phDevice,ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  Logger *this_00;
  long *plVar1;
  zes_device_handle_t *pp_Var2;
  ze_result_t result;
  ze_result_t zVar3;
  undefined8 uVar4;
  long lVar5;
  size_t i;
  long lVar6;
  long lVar7;
  zes_uuid_t uuid_00;
  allocator local_71;
  zes_device_handle_t *local_70;
  validation_layer *local_68;
  uint32_t *local_60;
  code *local_58;
  string local_50;
  
  lVar7 = context;
  local_70 = uuid.id._8_8_;
  uVar4 = uuid.id._0_8_;
  this_00 = *(Logger **)(context + 0xd50);
  local_68 = this;
  local_60 = (uint32_t *)onSubdevice;
  std::__cxx11::string::string
            ((string *)&local_50,
             "zesDriverGetDeviceByUuidExp(hDriver, uuid, phDevice, onSubdevice, subdeviceId)",
             &local_71);
  loader::Logger::log_trace(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar7 + 0x9f8) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar7 + 0xd38) - *(long *)(lVar7 + 0xd30) >> 3;
    lVar6 = 0;
    local_58 = *(code **)(lVar7 + 0x9f8);
    do {
      if (lVar5 == lVar6) {
        if ((*(char *)(context + 4) != '\x01') ||
           (uuid_00.id[8] = (char)uVar4, uuid_00.id[9] = (char)((ulong)uVar4 >> 8),
           uuid_00.id[10] = (char)((ulong)uVar4 >> 0x10),
           uuid_00.id[0xb] = (char)((ulong)uVar4 >> 0x18),
           uuid_00.id[0xc] = (char)((ulong)uVar4 >> 0x20),
           uuid_00.id[0xd] = (char)((ulong)uVar4 >> 0x28),
           uuid_00.id[0xe] = (char)((ulong)uVar4 >> 0x30),
           uuid_00.id[0xf] = (char)((ulong)uVar4 >> 0x38), uuid_00.id._0_8_ = hDriver,
           result = ZESHandleLifetimeValidation::zesDriverGetDeviceByUuidExpPrologue
                              ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),
                               (zes_driver_handle_t)local_68,uuid_00,local_70,(ze_bool_t *)phDevice,
                               local_60), result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(local_68,hDriver,uVar4,local_70,phDevice,local_60);
          lVar7 = 0;
          goto LAB_00173367;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar6 * 8) + 8);
      result = (**(code **)(*plVar1 + 0x890))
                         (plVar1,local_68,hDriver,uVar4,local_70,phDevice,local_60);
      lVar6 = lVar6 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_001733b4;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar7 * 8) + 8);
    result = (**(code **)(*plVar1 + 0x898))
                       (plVar1,local_68,hDriver,uVar4,local_70,phDevice,local_60,zVar3);
    lVar7 = lVar7 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00173367:
    pp_Var2 = local_70;
    lVar6 = context;
    if (lVar5 == lVar7) {
      result = zVar3;
      if (((zVar3 == ZE_RESULT_SUCCESS) && (local_70 != (zes_device_handle_t *)0x0)) &&
         (*(char *)(context + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(context + 0xd48),*local_70);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar6 + 0xd48),local_68,*pp_Var2);
      }
      break;
    }
  }
LAB_001733b4:
  logAndPropagateResult("zesDriverGetDeviceByUuidExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetDeviceByUuidExp(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        context.logger->log_trace("zesDriverGetDeviceByUuidExp(hDriver, uuid, phDevice, onSubdevice, subdeviceId)");

        auto pfnGetDeviceByUuidExp = context.zesDdiTable.DriverExp.pfnGetDeviceByUuidExp;

        if( nullptr == pfnGetDeviceByUuidExp )
            return logAndPropagateResult("zesDriverGetDeviceByUuidExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDriverGetDeviceByUuidExpPrologue( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDriverGetDeviceByUuidExpPrologue( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }

        auto driver_result = pfnGetDeviceByUuidExp( hDriver, uuid, phDevice, onSubdevice, subdeviceId );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDriverGetDeviceByUuidExpEpilogue( hDriver, uuid, phDevice, onSubdevice, subdeviceId ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phDevice){
                context.handleLifetime->addHandle( *phDevice );
                context.handleLifetime->addDependent( hDriver, *phDevice );

            }
        }
        return logAndPropagateResult("zesDriverGetDeviceByUuidExp", driver_result);
    }